

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoli.c
# Opt level: O2

int ffgsvi(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
          short nulval,short *array,int *anynul,int *status)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long firstelem;
  long lVar6;
  long lVar7;
  long lVar8;
  LONGLONG LVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  short *array_00;
  int local_3c8;
  char ldummy;
  long local_3c0;
  long local_3b8;
  long *local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  int hdutype;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  fitsfile *local_220;
  LONGLONG dsize [10];
  long dir [9];
  long str [9];
  long incr [9];
  long stp [9];
  LONGLONG blcll [9];
  
  if (naxis - 10U < 0xfffffff7) {
    snprintf((char *)blcll,0x51,"NAXIS = %d in call to ffgsvi is out of range",(ulong)(uint)naxis);
    ffpmsg((char *)blcll);
    *status = 0x140;
    iVar1 = 0x140;
  }
  else {
    local_3b0 = naxes;
    iVar1 = fits_is_compressed_image(fptr,status);
    uVar11 = (ulong)(uint)naxis;
    if (iVar1 == 0) {
      iVar1 = ffghdt(fptr,&hdutype,status);
      if (iVar1 < 1) {
        if (hdutype == 0) {
          local_3c0 = (long)(int)(colnum + (uint)(colnum == 0));
          local_3c8 = 2;
          local_348 = 1;
          local_3b8 = local_3c0;
        }
        else {
          local_3c0 = blc[uVar11];
          local_3b8 = trc[uVar11];
          local_348 = inc[uVar11];
          local_3c8 = colnum;
        }
        if (anynul != (int *)0x0) {
          *anynul = 0;
        }
        lVar3 = 1;
        for (lVar4 = 0; lVar4 != 9; lVar4 = lVar4 + 1) {
          str[lVar4] = 1;
          stp[lVar4] = 1;
          incr[lVar4] = 1;
          dsize[lVar4] = 1;
          dir[lVar4] = 1;
        }
        for (; local_220 = fptr, lVar3 - uVar11 != 1; lVar3 = lVar3 + 1) {
          lVar4 = trc[lVar3 + -1];
          lVar12 = blc[lVar3 + -1];
          if (lVar4 < lVar12) {
            if (hdutype != 0) {
              snprintf((char *)blcll,0x51,"ffgsvi: illegal range specified for axis %ld");
              ffpmsg((char *)blcll);
              *status = 0x141;
              return 0x141;
            }
            dsize[lVar3 + 9] = -1;
            LVar9 = -1;
          }
          else {
            LVar9 = dsize[lVar3 + 9];
          }
          str[lVar3 + -1] = lVar12;
          stp[lVar3 + -1] = lVar4;
          incr[lVar3 + -1] = inc[lVar3 + -1];
          dsize[lVar3] = local_3b0[lVar3 + -1] * dsize[lVar3 + -1];
          dsize[lVar3 + -1] = LVar9 * dsize[lVar3 + -1];
        }
        dsize[uVar11] = dir[uVar11] * dsize[uVar11];
        if ((naxis == 1) && (*local_3b0 == 1)) {
          lVar3 = (local_3b8 - local_3c0) / local_348;
          local_3b8 = local_3c0;
          local_370 = local_348;
        }
        else {
          lVar3 = ((stp[0] - CONCAT62(str[0]._2_6_,(short)str[0])) * dir[0]) / *inc;
          local_370 = dir[0] * incr[0];
        }
        local_2a8 = dir[8] * str[8];
        local_278 = stp[8] * dir[8];
        local_2b0 = dir[7] * str[7];
        local_280 = stp[7] * dir[7];
        local_2b8 = dir[6] * str[6];
        local_270 = stp[6] * dir[6];
        local_2a0 = dir[5] * str[5];
        local_268 = stp[5] * dir[5];
        local_298 = dir[4] * str[4];
        local_260 = stp[4] * dir[4];
        local_290 = dir[3] * str[3];
        local_258 = stp[3] * dir[3];
        local_288 = dir[2] * str[2];
        local_238 = stp[2] * dir[2];
        local_240 = dir[1] * str[1];
        local_3b0 = (long *)(stp[1] * dir[1]);
        local_2c0 = (str[1] + -1) * dir[1] * dsize[1] + (str[2] + -1) * dir[2] * dsize[2] +
                    (str[3] + -1) * dir[3] * dsize[3] +
                    (str[4] + -1) * dir[4] * dsize[4] + (str[5] + -1) * dir[5] * dsize[5] +
                    (str[6] + -1) * dir[6] * dsize[6] + (str[7] + -1) * dir[7] * dsize[7] +
                    (str[8] + -1) * dir[8] * dsize[8] + CONCAT62(str[0]._2_6_,(short)str[0]);
        local_360 = incr[8];
        local_350 = dsize[8] * incr[8];
        local_368 = incr[7];
        local_358 = dsize[7] * incr[7];
        local_340 = incr[6];
        local_338 = dsize[6] * incr[6];
        local_330 = incr[5];
        local_328 = dsize[5] * incr[5];
        local_320 = incr[4];
        local_318 = dsize[4] * incr[4];
        local_310 = incr[3];
        local_308 = dsize[3] * incr[3];
        local_2e8 = incr[2];
        local_2e0 = dsize[2] * incr[2];
        local_228 = dsize[1] * incr[1];
        local_230 = lVar3 * 2 + 2;
        lVar4 = 0;
        for (; local_3c0 <= local_3b8; local_3c0 = local_3c0 + local_348) {
          local_3a0 = local_2c0;
          local_300 = local_290;
          for (lVar12 = local_2a8; lVar12 <= local_278; lVar12 = lVar12 + local_360) {
            local_3a8 = local_3a0;
            local_2f0 = lVar12;
            for (lVar5 = local_2b0; lVar5 <= local_280; lVar5 = lVar5 + local_368) {
              local_398 = local_3a8;
              local_2f8 = lVar5;
              for (lVar6 = local_2b8; lVar6 <= local_270; lVar6 = lVar6 + local_340) {
                local_390 = local_398;
                local_2d8 = lVar6;
                for (lVar7 = local_2a0; lVar7 <= local_268; lVar7 = lVar7 + local_330) {
                  local_388 = local_390;
                  local_2d0 = lVar7;
                  for (lVar8 = local_298; lVar8 <= local_260; lVar8 = lVar8 + local_320) {
                    local_380 = local_388;
                    lVar10 = local_290;
                    local_2c8 = lVar8;
                    for (; local_250 = local_288, firstelem = local_380, local_290 <= local_258;
                        local_290 = local_290 + local_310) {
                      for (; local_250 <= local_238; local_250 = local_250 + local_2e8) {
                        array_00 = array + lVar4;
                        local_248 = firstelem;
                        for (lVar12 = local_240; lVar12 <= (long)local_3b0;
                            lVar12 = lVar12 + incr[1]) {
                          iVar1 = ffgcli(local_220,local_3c8,local_3c0,firstelem,lVar3 + 1,local_370
                                         ,1,nulval,array_00,&ldummy,(int *)blcll,status);
                          if (0 < iVar1) goto LAB_0018bc4a;
                          if ((anynul != (int *)0x0) && ((int)blcll[0] != 0)) {
                            *anynul = 1;
                          }
                          lVar4 = lVar4 + lVar3 + 1;
                          firstelem = firstelem + local_228;
                          array_00 = (short *)((long)array_00 + local_230);
                        }
                        lVar12 = local_2f0;
                        lVar5 = local_2f8;
                        firstelem = local_248 + local_2e0;
                        lVar6 = local_2d8;
                        lVar7 = local_2d0;
                        lVar8 = local_2c8;
                      }
                      local_380 = local_380 + local_308;
                      lVar10 = local_300;
                    }
                    local_388 = local_388 + local_318;
                    local_290 = lVar10;
                  }
                  local_390 = local_390 + local_328;
                }
                local_398 = local_398 + local_338;
              }
              local_3a8 = local_3a8 + local_358;
            }
            local_3a0 = local_3a0 + local_350;
          }
        }
LAB_0018bc4a:
        return *status;
      }
    }
    else {
      for (uVar2 = 0; uVar11 != uVar2; uVar2 = uVar2 + 1) {
        blcll[uVar2] = blc[uVar2];
        dsize[uVar2] = trc[uVar2];
      }
      str[0]._0_2_ = nulval;
      fits_read_compressed_img(fptr,0x15,blcll,dsize,inc,1,str,array,(char *)0x0,anynul,status);
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgsvi(fitsfile *fptr, /* I - FITS file pointer                         */
           int  colnum,    /* I - number of the column to read (1 = 1st)    */
           int naxis,      /* I - number of dimensions in the FITS array    */
           long  *naxes,   /* I - size of each dimension                    */
           long  *blc,     /* I - 'bottom left corner' of the subsection    */
           long  *trc,     /* I - 'top right corner' of the subsection      */
           long  *inc,     /* I - increment to be applied in each dimension */
           short nulval,   /* I - value to set undefined pixels             */
           short *array,   /* O - array to be filled and returned           */
           int  *anynul,   /* O - set to 1 if any values are null; else 0   */
           int  *status)   /* IO - error status                             */
/*
  Read a subsection of data values from an image or a table column.
  This routine is set up to handle a maximum of nine dimensions.
*/
{
    long ii,i0, i1,i2,i3,i4,i5,i6,i7,i8,row,rstr,rstp,rinc;
    long str[9],stp[9],incr[9],dir[9];
    long nelem, nultyp, ninc, numcol;
    LONGLONG felem, dsize[10], blcll[9], trcll[9];
    int hdutype, anyf;
    char ldummy, msg[FLEN_ERRMSG];
    int nullcheck = 1;
    short nullvalue;

    if (naxis < 1 || naxis > 9)
    {
        snprintf(msg,FLEN_ERRMSG, "NAXIS = %d in call to ffgsvi is out of range", naxis);
        ffpmsg(msg);
        return(*status = BAD_DIMEN);
    }

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        for (ii=0; ii < naxis; ii++) {
	    blcll[ii] = blc[ii];
	    trcll[ii] = trc[ii];
	}

        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TSHORT, blcll, trcll, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);

        return(*status);
    }

/*
    if this is a primary array, then the input COLNUM parameter should
    be interpreted as the row number, and we will alway read the image
    data from column 2 (any group parameters are in column 1).
*/
    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == IMAGE_HDU)
    {
        /* this is a primary array, or image extension */
        if (colnum == 0)
        {
            rstr = 1;
            rstp = 1;
        }
        else
        {
            rstr = colnum;
            rstp = colnum;
        }
        rinc = 1;
        numcol = 2;
    }
    else
    {
        /* this is a table, so the row info is in the (naxis+1) elements */
        rstr = blc[naxis];
        rstp = trc[naxis];
        rinc = inc[naxis];
        numcol = colnum;
    }

    nultyp = 1;
    if (anynul)
        *anynul = FALSE;

    i0 = 0;
    for (ii = 0; ii < 9; ii++)
    {
        str[ii] = 1;
        stp[ii] = 1;
        incr[ii] = 1;
        dsize[ii] = 1;
        dir[ii] = 1;
    }

    for (ii = 0; ii < naxis; ii++)
    {
      if (trc[ii] < blc[ii])
      {
        if (hdutype == IMAGE_HDU)
        {
           dir[ii] = -1;
        }
        else
        {
          snprintf(msg, FLEN_ERRMSG,"ffgsvi: illegal range specified for axis %ld", ii + 1);
          ffpmsg(msg);
          return(*status = BAD_PIX_NUM);
        }
      }

      str[ii] = blc[ii];
      stp[ii] = trc[ii];
      incr[ii] = inc[ii];
      dsize[ii + 1] = dsize[ii] * naxes[ii];
      dsize[ii] = dsize[ii] * dir[ii];
    }
    dsize[naxis] = dsize[naxis] * dir[naxis];

    if (naxis == 1 && naxes[0] == 1)
    {
      /* This is not a vector column, so read all the rows at once */
      nelem = (rstp - rstr) / rinc + 1;
      ninc = rinc;
      rstp = rstr;
    }
    else
    {
      /* have to read each row individually, in all dimensions */
      nelem = (stp[0]*dir[0] - str[0]*dir[0]) / inc[0] + 1;
      ninc = incr[0] * dir[0];
    }

    for (row = rstr; row <= rstp; row += rinc)
    {
     for (i8 = str[8]*dir[8]; i8 <= stp[8]*dir[8]; i8 += incr[8])
     {
      for (i7 = str[7]*dir[7]; i7 <= stp[7]*dir[7]; i7 += incr[7])
      {
       for (i6 = str[6]*dir[6]; i6 <= stp[6]*dir[6]; i6 += incr[6])
       {
        for (i5 = str[5]*dir[5]; i5 <= stp[5]*dir[5]; i5 += incr[5])
        {
         for (i4 = str[4]*dir[4]; i4 <= stp[4]*dir[4]; i4 += incr[4])
         {
          for (i3 = str[3]*dir[3]; i3 <= stp[3]*dir[3]; i3 += incr[3])
          {
           for (i2 = str[2]*dir[2]; i2 <= stp[2]*dir[2]; i2 += incr[2])
           {
            for (i1 = str[1]*dir[1]; i1 <= stp[1]*dir[1]; i1 += incr[1])
            {

              felem=str[0] + (i1 - dir[1]) * dsize[1] + (i2 - dir[2]) * dsize[2] + 
                             (i3 - dir[3]) * dsize[3] + (i4 - dir[4]) * dsize[4] +
                             (i5 - dir[5]) * dsize[5] + (i6 - dir[6]) * dsize[6] +
                             (i7 - dir[7]) * dsize[7] + (i8 - dir[8]) * dsize[8];

              if ( ffgcli(fptr, numcol, row, felem, nelem, ninc, nultyp,
                   nulval, &array[i0], &ldummy, &anyf, status) > 0)
                   return(*status);

              if (anyf && anynul)
                  *anynul = TRUE;

              i0 += nelem;
            }
           }
          }
         }
        }
       }
      }
     }
    }
    return(*status);
}